

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spanning.cpp
# Opt level: O0

void dsu_unite(int u,int v)

{
  int iVar1;
  uint uVar2;
  reference pvVar3;
  int local_10;
  int local_c;
  int v_local;
  int u_local;
  
  local_10 = v;
  local_c = u;
  local_c = dsu_get(u);
  local_10 = dsu_get(local_10);
  uVar2 = rand();
  if ((uVar2 & 1) != 0) {
    std::swap<int>(&local_c,&local_10);
  }
  iVar1 = local_10;
  if (local_c != local_10) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::p,(long)local_c)
    ;
    *pvVar3 = iVar1;
  }
  return;
}

Assistant:

void dsu_unite(int u, int v) {
    u = dsu_get(u);
    v = dsu_get(v);

    if (rand() & 1)
        swap(u, v);

    if (u != v)
        p[u] = v;
}